

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::Marray<unsigned_char,std::allocator<unsigned_long>>::
resizeHelper<false,unsigned_long_const*>
          (Marray<unsigned_char,std::allocator<unsigned_long>> *this,unsigned_long *begin,
          unsigned_long *end,uchar *value)

{
  allocator<unsigned_long> *paVar1;
  undefined1 *this_00;
  unsigned_long uVar2;
  value_type vVar3;
  uchar *__p;
  ulong uVar4;
  uchar *data;
  size_t sVar5;
  size_type sVar6;
  unsigned_long *puVar7;
  reference pvVar8;
  iterator iVar9;
  iterator end_00;
  CoordinateOrder *pCVar10;
  CoordinateOrder *pCVar11;
  allocator<unsigned_char> local_231;
  unsigned_long *local_230;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_228;
  allocator<unsigned_char> local_219;
  undefined1 local_218 [8];
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> view2;
  undefined1 local_1c0 [8];
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> viewT;
  allocator<unsigned_char> local_169;
  undefined1 local_168 [8];
  View<unsigned_char,_true,_std::allocator<unsigned_long>_> view1;
  size_type local_120;
  size_t local_118;
  ulong local_110;
  size_t j_1;
  value_type_conflict local_100;
  undefined1 local_f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2;
  value_type_conflict local_d8;
  undefined1 local_d0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape1;
  undefined1 local_b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> base2;
  undefined1 local_90 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> base1;
  size_t j;
  value_type *newData;
  value_type_conflict local_58;
  size_t x;
  unsigned_long *it;
  size_t newSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape;
  uchar *value_local;
  unsigned_long *end_local;
  unsigned_long *begin_local;
  Marray<unsigned_char,_std::allocator<unsigned_long>_> *this_local;
  
  newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)value;
  Marray<unsigned_char,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
  it = (unsigned_long *)0x1;
  for (x = (size_t)begin; (unsigned_long *)x != end; x = x + 8) {
    local_58 = *(value_type_conflict *)x;
    marray_detail::Assert<bool>(local_58 != 0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize,&local_58);
    it = (unsigned_long *)(local_58 * (long)it);
  }
  data = __gnu_cxx::new_allocator<unsigned_char>::allocate
                   ((new_allocator<unsigned_char> *)(this + 0x40),(size_type)it,(void *)0x0);
  for (base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < it;
      base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    data[(long)base1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage] =
         (uchar)*newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  }
  if (*(long *)this == 0) goto LAB_0010d00f;
  if (it == (unsigned_long *)0x1) {
LAB_0010c96f:
    *data = **(uchar **)this;
  }
  else {
    sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    if (sVar5 == 0) goto LAB_0010c96f;
    sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    paVar1 = (allocator<unsigned_long> *)
             ((long)&base2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_long>::allocator(paVar1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90,sVar5,paVar1);
    std::allocator<unsigned_long>::~allocator
              ((allocator<unsigned_long> *)
               ((long)&base2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
    paVar1 = (allocator<unsigned_long> *)
             ((long)&shape1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_long>::allocator(paVar1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0,sVar6,paVar1);
    std::allocator<unsigned_long>::~allocator
              ((allocator<unsigned_long> *)
               ((long)&shape1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    local_d8 = 1;
    paVar1 = (allocator<unsigned_long> *)
             ((long)&shape2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_long>::allocator(paVar1);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,sVar5,&local_d8,
               paVar1);
    std::allocator<unsigned_long>::~allocator
              ((allocator<unsigned_long> *)
               ((long)&shape2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
    local_100 = 1;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&j_1 + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,sVar6,&local_100,
               (allocator<unsigned_long> *)((long)&j_1 + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&j_1 + 7));
    local_110 = 0;
    while( true ) {
      uVar4 = local_110;
      local_118 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
      local_120 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
      puVar7 = std::min<unsigned_long>(&local_118,&local_120);
      if (*puVar7 <= uVar4) break;
      view1.geometry_._48_8_ =
           View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                     ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this,local_110);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize,
                          local_110);
      puVar7 = std::min<unsigned_long>((unsigned_long *)&view1.geometry_.coordinateOrder_,pvVar8);
      uVar2 = *puVar7;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,
                          local_110);
      *pvVar8 = uVar2;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,
                          local_110);
      vVar3 = *pvVar8;
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,
                          local_110);
      *pvVar8 = vVar3;
      local_110 = local_110 + 1;
    }
    std::allocator<unsigned_char>::allocator(&local_169);
    View<unsigned_char,_true,_std::allocator<unsigned_long>_>::View
              ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_168,&local_169);
    std::allocator<unsigned_char>::~allocator(&local_169);
    iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
    viewT.geometry_._48_8_ =
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
    View<unsigned_char,false,std::allocator<unsigned_long>>::
    constView<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<unsigned_char,false,std::allocator<unsigned_long>> *)this,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar9._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )viewT.geometry_._48_8_,
               (View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_168);
    iVar9 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
    end_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
    pCVar10 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                        ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    pCVar11 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                        ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
    this_00 = &view2.geometry_.field_0x37;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)this_00);
    View<unsigned_char,false,std::allocator<unsigned_long>>::
    View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_1c0,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )iVar9._M_current,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )end_00._M_current,data,pCVar10,pCVar11,(allocator_type *)this_00);
    std::allocator<unsigned_char>::~allocator
              ((allocator<unsigned_char> *)&view2.geometry_.field_0x37);
    std::allocator<unsigned_char>::allocator(&local_219);
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View
              ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_218,&local_219);
    std::allocator<unsigned_char>::~allocator(&local_219);
    local_228._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
    local_230 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
    View<unsigned_char,false,std::allocator<unsigned_long>>::
    view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
              ((View<unsigned_char,false,std::allocator<unsigned_long>> *)local_1c0,local_228,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )local_230,(View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_218);
    View<unsigned_char,_true,_std::allocator<unsigned_long>_>::squeeze
              ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_168);
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::squeeze
              ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_218);
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator=
              ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_218,
               (View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_168);
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::~View
              ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_218);
    View<unsigned_char,_false,_std::allocator<unsigned_long>_>::~View
              ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_1c0);
    View<unsigned_char,_true,_std::allocator<unsigned_long>_>::~View
              ((View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)local_168);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_90);
  }
  __p = *(uchar **)this;
  sVar5 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::size
                    ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  __gnu_cxx::new_allocator<unsigned_char>::deallocate
            ((new_allocator<unsigned_char> *)(this + 0x40),__p,sVar5);
  *(undefined8 *)this = 0;
LAB_0010d00f:
  pCVar10 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                      ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
  pCVar11 = marray_detail::Geometry<std::allocator<unsigned_long>_>::coordinateOrder
                      ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
  std::allocator<unsigned_char>::allocator(&local_231);
  View<unsigned_char,false,std::allocator<unsigned_long>>::assign<unsigned_long_const*>
            ((View<unsigned_char,false,std::allocator<unsigned_long>> *)this,begin,end,data,pCVar10,
             pCVar11,&local_231);
  std::allocator<unsigned_char>::~allocator(&local_231);
  Marray<unsigned_char,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&newSize);
  return;
}

Assistant:

inline void
Marray<T, A>::resizeHelper
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value
)
{   
    testInvariant();
    // compute size
    std::vector<std::size_t> newShape;
    std::size_t newSize = 1;
    for(ShapeIterator it = begin; it != end; ++it) {
        std::size_t x = static_cast<std::size_t>(*it);
        marray_detail::Assert(MARRAY_NO_ARG_TEST || x > 0);
        newShape.push_back(x);
        newSize *= x;
    }
    // allocate new
    value_type* newData = dataAllocator_.allocate(newSize); 
    if(!SKIP_INITIALIZATION) {
        for(std::size_t j=0; j<newSize; ++j) {
            newData[j] = value;
        }
    }
    // copy old data in region of overlap
    if(this->data_ != 0) {
        if(newSize == 1 || this->dimension() == 0) {
            newData[0] = this->data_[0];
        }
        else {
            std::vector<std::size_t> base1(this->dimension());
            std::vector<std::size_t> base2(newShape.size());
            std::vector<std::size_t> shape1(this->dimension(), 1);
            std::vector<std::size_t> shape2(newShape.size(), 1);
            for(std::size_t j=0; j<std::min(this->dimension(), newShape.size()); ++j) {
                shape1[j] = std::min(this->shape(j), newShape[j]);
                shape2[j] = shape1[j];
            }
            View<T, true, A> view1;
            this->constView(base1.begin(), shape1.begin(), view1);
            View<T, false, A> viewT(newShape.begin(), newShape.end(),
                newData, this->coordinateOrder(),
                this->coordinateOrder());
            View<T, false, A> view2;
            viewT.view(base2.begin(), shape2.begin(), view2);
            view1.squeeze();
            view2.squeeze();
            view2 = view1; // copy
        }
        dataAllocator_.deallocate(this->data_, this->size()); 
        this->data_ = 0;
    }
    base::assign(begin, end, newData, this->geometry_.coordinateOrder(),
        this->geometry_.coordinateOrder());
    testInvariant();
}